

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O1

StringSet * __thiscall
OSTEI_VRR_Algorithm_Base::GenerateVarReq_abi_cxx11_
          (StringSet *__return_storage_ptr__,OSTEI_VRR_Algorithm_Base *this,QAM *am,
          RRStepType rrstep)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  OSTEI_VRR_Algorithm_Base *this_00;
  QAMList amreq;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  QAMList local_250;
  undefined1 local_238 [16];
  _Alloc_hider local_228;
  char local_218 [16];
  undefined1 local_208 [16];
  _Alloc_hider local_1f8;
  char local_1e8 [16];
  undefined1 local_1d8 [16];
  _Alloc_hider local_1c8;
  char local_1b8 [16];
  undefined1 local_1a8 [16];
  _Alloc_hider local_198;
  char local_188 [16];
  undefined1 local_178 [16];
  _Alloc_hider local_168;
  char local_158 [16];
  undefined1 local_148 [16];
  _Alloc_hider local_138;
  char local_128 [16];
  undefined1 local_118 [16];
  _Alloc_hider local_108;
  char local_f8 [16];
  undefined1 local_e8 [16];
  _Alloc_hider local_d8;
  char local_c8 [16];
  undefined1 local_b8 [16];
  _Alloc_hider local_a8;
  char local_98 [16];
  undefined1 local_88 [16];
  _Alloc_hider local_78;
  char local_68 [16];
  undefined1 local_58 [16];
  _Alloc_hider local_48;
  char local_38 [16];
  
  local_58._0_4_ = (am->qam)._M_elems[0];
  local_58._4_4_ = (am->qam)._M_elems[1];
  local_58._8_4_ = (am->qam)._M_elems[2];
  local_58._12_4_ = (am->qam)._M_elems[3];
  this_00 = (OSTEI_VRR_Algorithm_Base *)(am->tag)._M_dataplus._M_p;
  local_48._M_p = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,this_00,
             (long)(&(this_00->info_).super_GeneratorInfoBase.finalam_.qam + 0xffffffffffffffff) +
             (am->tag)._M_string_length);
  GenerateAMReq(&local_250,this_00,(QAM *)local_58,rrstep,true);
  if (local_48._M_p != local_38) {
    operator_delete(local_48._M_p);
  }
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (rrstep < K) {
    local_88._0_4_ =
         ((local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
          _M_start)->qam)._M_elems[0];
    local_88._4_4_ =
         ((local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
          _M_start)->qam)._M_elems[1];
    local_88._8_4_ =
         ((local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
          _M_start)->qam)._M_elems[2];
    local_88._12_4_ =
         ((local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
          _M_start)->qam)._M_elems[3];
    pcVar3 = ((local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
               super__Vector_impl_data._M_start)->tag)._M_dataplus._M_p;
    local_78._M_p = local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar3,
               pcVar3 + ((local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
                          super__Vector_impl_data._M_start)->tag)._M_string_length);
    bVar4 = ValidQAM((QAM *)local_88);
    if (local_78._M_p != local_68) {
      operator_delete(local_78._M_p);
    }
    if (bVar4) {
      paVar2 = &local_270.field_2;
      local_270._M_dataplus._M_p = (pointer)paVar2;
      if (rrstep == I) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"P_PA","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)__return_storage_ptr__,&local_270);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"P_PB","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)__return_storage_ptr__,&local_270);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != paVar2) {
        operator_delete(local_270._M_dataplus._M_p);
      }
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"aop_PQ","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)__return_storage_ptr__,&local_270);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p);
      }
    }
    local_b8._0_4_ =
         local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
         _M_start[1].qam._M_elems[0];
    local_b8._4_4_ =
         local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
         _M_start[1].qam._M_elems[1];
    local_b8._8_4_ =
         local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
         _M_start[1].qam._M_elems[2];
    local_b8._12_4_ =
         local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
         _M_start[1].qam._M_elems[3];
    pcVar3 = local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data
             ._M_start[1].tag._M_dataplus._M_p;
    local_a8._M_p = local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,pcVar3,
               pcVar3 + local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
                        super__Vector_impl_data._M_start[1].tag._M_string_length);
    bVar5 = ValidQAM((QAM *)local_b8);
    bVar4 = true;
    if (!bVar5) {
      local_e8._0_4_ =
           local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
           _M_start[2].qam._M_elems[0];
      local_e8._4_4_ =
           local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
           _M_start[2].qam._M_elems[1];
      local_e8._8_4_ =
           local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
           _M_start[2].qam._M_elems[2];
      local_e8._12_4_ =
           local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
           _M_start[2].qam._M_elems[3];
      local_d8._M_p = local_c8;
      pcVar3 = local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
               super__Vector_impl_data._M_start[2].tag._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,pcVar3,
                 pcVar3 + local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
                          super__Vector_impl_data._M_start[2].tag._M_string_length);
      bVar4 = ValidQAM((QAM *)local_e8);
      if (local_d8._M_p != local_c8) {
        operator_delete(local_d8._M_p);
      }
    }
    if (local_a8._M_p != local_98) {
      operator_delete(local_a8._M_p);
    }
    if (bVar4 != false) {
      paVar2 = &local_270.field_2;
      local_270._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"one_over_2p","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)__return_storage_ptr__,&local_270);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != paVar2) {
        operator_delete(local_270._M_dataplus._M_p);
      }
      local_270._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"a_over_p","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)__return_storage_ptr__,&local_270);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != paVar2) {
        operator_delete(local_270._M_dataplus._M_p);
      }
    }
    local_118._0_4_ =
         local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
         _M_start[3].qam._M_elems[0];
    local_118._4_4_ =
         local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
         _M_start[3].qam._M_elems[1];
    local_118._8_4_ =
         local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
         _M_start[3].qam._M_elems[2];
    local_118._12_4_ =
         local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
         _M_start[3].qam._M_elems[3];
    pcVar3 = local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data
             ._M_start[3].tag._M_dataplus._M_p;
    local_108._M_p = local_f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,pcVar3,
               pcVar3 + local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
                        super__Vector_impl_data._M_start[3].tag._M_string_length);
    bVar5 = ValidQAM((QAM *)local_118);
    bVar4 = true;
    if (!bVar5) {
      local_148._0_4_ =
           local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
           _M_start[4].qam._M_elems[0];
      local_148._4_4_ =
           local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
           _M_start[4].qam._M_elems[1];
      local_148._8_4_ =
           local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
           _M_start[4].qam._M_elems[2];
      local_148._12_4_ =
           local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
           _M_start[4].qam._M_elems[3];
      local_138._M_p = local_128;
      pcVar3 = local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
               super__Vector_impl_data._M_start[4].tag._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_138,pcVar3,
                 pcVar3 + local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
                          super__Vector_impl_data._M_start[4].tag._M_string_length);
      bVar4 = ValidQAM((QAM *)local_148);
      if (local_138._M_p != local_128) {
        operator_delete(local_138._M_p);
      }
    }
    if (local_108._M_p != local_f8) {
      operator_delete(local_108._M_p);
    }
    if (bVar4 == false) goto LAB_0010e38d;
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"one_over_2pq","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)__return_storage_ptr__,&local_270);
  }
  else {
    local_178._0_4_ =
         ((local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
          _M_start)->qam)._M_elems[0];
    local_178._4_4_ =
         ((local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
          _M_start)->qam)._M_elems[1];
    local_178._8_4_ =
         ((local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
          _M_start)->qam)._M_elems[2];
    local_178._12_4_ =
         ((local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
          _M_start)->qam)._M_elems[3];
    pcVar3 = ((local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
               super__Vector_impl_data._M_start)->tag)._M_dataplus._M_p;
    local_168._M_p = local_158;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_168,pcVar3,
               pcVar3 + ((local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
                          super__Vector_impl_data._M_start)->tag)._M_string_length);
    bVar4 = ValidQAM((QAM *)local_178);
    if (local_168._M_p != local_158) {
      operator_delete(local_168._M_p);
    }
    if (bVar4) {
      paVar2 = &local_270.field_2;
      local_270._M_dataplus._M_p = (pointer)paVar2;
      if (rrstep == K) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"Q_PA","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)__return_storage_ptr__,&local_270);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"Q_PB","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)__return_storage_ptr__,&local_270);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != paVar2) {
        operator_delete(local_270._M_dataplus._M_p);
      }
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"aoq_PQ","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)__return_storage_ptr__,&local_270);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p);
      }
    }
    local_1a8._0_4_ =
         local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
         _M_start[1].qam._M_elems[0];
    local_1a8._4_4_ =
         local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
         _M_start[1].qam._M_elems[1];
    local_1a8._8_4_ =
         local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
         _M_start[1].qam._M_elems[2];
    local_1a8._12_4_ =
         local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
         _M_start[1].qam._M_elems[3];
    pcVar3 = local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data
             ._M_start[1].tag._M_dataplus._M_p;
    local_198._M_p = local_188;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_198,pcVar3,
               pcVar3 + local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
                        super__Vector_impl_data._M_start[1].tag._M_string_length);
    bVar5 = ValidQAM((QAM *)local_1a8);
    bVar4 = true;
    if (!bVar5) {
      local_1d8._0_4_ =
           local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
           _M_start[2].qam._M_elems[0];
      local_1d8._4_4_ =
           local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
           _M_start[2].qam._M_elems[1];
      local_1d8._8_4_ =
           local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
           _M_start[2].qam._M_elems[2];
      local_1d8._12_4_ =
           local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
           _M_start[2].qam._M_elems[3];
      local_1c8._M_p = local_1b8;
      pcVar3 = local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
               super__Vector_impl_data._M_start[2].tag._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c8,pcVar3,
                 pcVar3 + local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
                          super__Vector_impl_data._M_start[2].tag._M_string_length);
      bVar4 = ValidQAM((QAM *)local_1d8);
      if (local_1c8._M_p != local_1b8) {
        operator_delete(local_1c8._M_p);
      }
    }
    if (local_198._M_p != local_188) {
      operator_delete(local_198._M_p);
    }
    if (bVar4 != false) {
      paVar2 = &local_270.field_2;
      local_270._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"one_over_2q","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)__return_storage_ptr__,&local_270);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != paVar2) {
        operator_delete(local_270._M_dataplus._M_p);
      }
      local_270._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"a_over_q","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)__return_storage_ptr__,&local_270);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != paVar2) {
        operator_delete(local_270._M_dataplus._M_p);
      }
    }
    local_208._0_4_ =
         local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
         _M_start[3].qam._M_elems[0];
    local_208._4_4_ =
         local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
         _M_start[3].qam._M_elems[1];
    local_208._8_4_ =
         local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
         _M_start[3].qam._M_elems[2];
    local_208._12_4_ =
         local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
         _M_start[3].qam._M_elems[3];
    pcVar3 = local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data
             ._M_start[3].tag._M_dataplus._M_p;
    local_1f8._M_p = local_1e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,pcVar3,
               pcVar3 + local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
                        super__Vector_impl_data._M_start[3].tag._M_string_length);
    bVar5 = ValidQAM((QAM *)local_208);
    bVar4 = true;
    if (!bVar5) {
      local_238._0_4_ =
           local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
           _M_start[4].qam._M_elems[0];
      local_238._4_4_ =
           local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
           _M_start[4].qam._M_elems[1];
      local_238._8_4_ =
           local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
           _M_start[4].qam._M_elems[2];
      local_238._12_4_ =
           local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
           _M_start[4].qam._M_elems[3];
      local_228._M_p = local_218;
      pcVar3 = local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
               super__Vector_impl_data._M_start[4].tag._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_228,pcVar3,
                 pcVar3 + local_250.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
                          super__Vector_impl_data._M_start[4].tag._M_string_length);
      bVar4 = ValidQAM((QAM *)local_238);
      if (local_228._M_p != local_218) {
        operator_delete(local_228._M_p);
      }
    }
    if (local_1f8._M_p != local_1e8) {
      operator_delete(local_1f8._M_p);
    }
    if (bVar4 == false) goto LAB_0010e38d;
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"one_over_2pq","");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)__return_storage_ptr__,&local_270);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
LAB_0010e38d:
  std::vector<QAM,_std::allocator<QAM>_>::~vector(&local_250);
  return __return_storage_ptr__;
}

Assistant:

StringSet OSTEI_VRR_Algorithm_Base::GenerateVarReq(QAM am, RRStepType rrstep) const
{
    auto amreq = GenerateAMReq(am, rrstep, true);

    StringSet req;


    if(rrstep == RRStepType::I || rrstep == RRStepType::J)
    {
        if(ValidQAM(amreq[0]))
        {
            if(rrstep == RRStepType::I)
                req.insert("P_PA");
            else
                req.insert("P_PB");

            req.insert("aop_PQ");
        }

        if(ValidQAM(amreq[1]) || ValidQAM(amreq[2]))
        {
            req.insert("one_over_2p");
            req.insert("a_over_p");
        }

        if(ValidQAM(amreq[3]) || ValidQAM(amreq[4]))
            req.insert("one_over_2pq");
    }
    else
    {
        if(ValidQAM(amreq[0]))
        {
            if(rrstep == RRStepType::K)
                req.insert("Q_PA");
            else
                req.insert("Q_PB");

            req.insert("aoq_PQ");
        }

        if(ValidQAM(amreq[1]) || ValidQAM(amreq[2]))
        {
            req.insert("one_over_2q");
            req.insert("a_over_q");
        }

        if(ValidQAM(amreq[3]) || ValidQAM(amreq[4]))
            req.insert("one_over_2pq");
    }

    return req;

}